

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O1

void glu::TextureTestUtil::computeQuadTexCoord3D
               (vector<float,_std::allocator<float>_> *dst,Vec3 *p0,Vec3 *p1,IVec3 *dirSwz)

{
  pointer pfVar1;
  int i;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  Vec3 v3;
  Vec3 v2;
  Vec3 v0;
  Vec3 v1;
  Vec3 f3;
  Vec3 f2;
  Vec3 f1;
  Vector<float,_3> res_6;
  Vector<float,_3> res_9;
  Vec3 f0;
  float local_90 [4];
  float local_80 [4];
  undefined8 local_70;
  float local_68;
  float local_60 [16];
  float local_20 [6];
  
  lVar2 = 0;
  local_60[9] = 0.0;
  local_60[10] = 0.0;
  local_60[0xb] = 0.0;
  lVar4 = (long)dirSwz->m_data[0];
  lVar5 = (long)dirSwz->m_data[1];
  lVar3 = (long)dirSwz->m_data[2];
  local_20[3] = local_60[lVar4 + 9];
  local_20[4] = local_60[lVar5 + 9];
  local_20[5] = local_60[lVar3 + 9];
  local_60[6] = 0.0;
  local_60[7] = 1.0;
  local_60[8] = 0.0;
  local_60[10] = local_60[lVar5 + 6];
  local_60[9] = local_60[lVar4 + 6];
  local_60[0xb] = local_60[lVar3 + 6];
  local_60[3] = 1.0;
  local_60[4] = 0.0;
  local_60[5] = 0.0;
  local_60[7] = local_60[lVar5 + 3];
  local_60[6] = local_60[lVar4 + 3];
  local_60[8] = local_60[lVar3 + 3];
  local_70 = &DAT_3f8000003f800000;
  local_68 = 0.0;
  local_60[4] = (float)*(undefined4 *)((long)&local_70 + lVar5 * 4);
  local_60[3] = (float)*(undefined4 *)((long)&local_70 + lVar4 * 4);
  local_60[5] = (float)*(undefined4 *)((long)&local_70 + lVar3 * 4);
  local_80[2] = 0.0;
  local_80[0] = 0.0;
  local_80[1] = 0.0;
  do {
    local_80[lVar2] = p1->m_data[lVar2] - p0->m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_60[2] = 0.0;
  local_60[0] = 0.0;
  local_60[1] = 0.0;
  lVar2 = 0;
  do {
    local_60[lVar2] = local_80[lVar2] * local_20[lVar2 + 3];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_68 = 0.0;
  local_70 = (undefined1 *)0x0;
  lVar2 = 0;
  do {
    *(float *)((long)&local_70 + lVar2 * 4) = p0->m_data[lVar2] + local_60[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_90[2] = 0.0;
  local_90[0] = 0.0;
  local_90[1] = 0.0;
  lVar2 = 0;
  do {
    local_90[lVar2] = p1->m_data[lVar2] - p0->m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_80[2] = 0.0;
  local_80[0] = 0.0;
  local_80[1] = 0.0;
  lVar2 = 0;
  do {
    local_80[lVar2] = local_90[lVar2] * local_60[lVar2 + 9];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_60[2] = 0.0;
  local_60[0] = 0.0;
  local_60[1] = 0.0;
  lVar2 = 0;
  do {
    local_60[lVar2] = p0->m_data[lVar2] + local_80[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_60[0xe] = 0.0;
  local_60[0xc] = 0.0;
  local_60[0xd] = 0.0;
  lVar2 = 0;
  do {
    local_60[lVar2 + 0xc] = p1->m_data[lVar2] - p0->m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_90[2] = 0.0;
  local_90[0] = 0.0;
  local_90[1] = 0.0;
  lVar2 = 0;
  do {
    local_90[lVar2] = local_60[lVar2 + 0xc] * local_60[lVar2 + 6];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_80[2] = 0.0;
  local_80[0] = 0.0;
  local_80[1] = 0.0;
  lVar2 = 0;
  do {
    local_80[lVar2] = p0->m_data[lVar2] + local_90[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_20[2] = 0.0;
  local_20[0] = 0.0;
  local_20[1] = 0.0;
  lVar2 = 0;
  do {
    local_20[lVar2] = p1->m_data[lVar2] - p0->m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_60[0xe] = 0.0;
  local_60[0xc] = 0.0;
  local_60[0xd] = 0.0;
  lVar2 = 0;
  do {
    local_60[lVar2 + 0xc] = local_20[lVar2] * local_60[lVar2 + 3];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_90[2] = 0.0;
  local_90[0] = 0.0;
  local_90[1] = 0.0;
  lVar2 = 0;
  do {
    local_90[lVar2] = p0->m_data[lVar2] + local_60[lVar2 + 0xc];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  std::vector<float,_std::allocator<float>_>::resize(dst,0xc);
  pfVar1 = (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  *pfVar1 = (float)local_70;
  pfVar1[1] = local_70._4_4_;
  pfVar1[2] = local_68;
  pfVar1[3] = local_60[0];
  pfVar1[4] = local_60[1];
  pfVar1[5] = local_60[2];
  pfVar1[6] = local_80[0];
  pfVar1[7] = local_80[1];
  pfVar1[8] = local_80[2];
  pfVar1[9] = local_90[0];
  pfVar1[10] = local_90[1];
  pfVar1[0xb] = local_90[2];
  return;
}

Assistant:

void computeQuadTexCoord3D (std::vector<float>& dst, const tcu::Vec3& p0, const tcu::Vec3& p1, const tcu::IVec3& dirSwz)
{
	tcu::Vec3 f0 = tcu::Vec3(0.0f, 0.0f, 0.0f).swizzle(dirSwz[0], dirSwz[1], dirSwz[2]);
	tcu::Vec3 f1 = tcu::Vec3(0.0f, 1.0f, 0.0f).swizzle(dirSwz[0], dirSwz[1], dirSwz[2]);
	tcu::Vec3 f2 = tcu::Vec3(1.0f, 0.0f, 0.0f).swizzle(dirSwz[0], dirSwz[1], dirSwz[2]);
	tcu::Vec3 f3 = tcu::Vec3(1.0f, 1.0f, 0.0f).swizzle(dirSwz[0], dirSwz[1], dirSwz[2]);

	tcu::Vec3 v0 = p0 + (p1-p0)*f0;
	tcu::Vec3 v1 = p0 + (p1-p0)*f1;
	tcu::Vec3 v2 = p0 + (p1-p0)*f2;
	tcu::Vec3 v3 = p0 + (p1-p0)*f3;

	dst.resize(4*3);

	dst[0] = v0.x(); dst[ 1] = v0.y(); dst[ 2] = v0.z();
	dst[3] = v1.x(); dst[ 4] = v1.y(); dst[ 5] = v1.z();
	dst[6] = v2.x(); dst[ 7] = v2.y(); dst[ 8] = v2.z();
	dst[9] = v3.x(); dst[10] = v3.y(); dst[11] = v3.z();
}